

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_protocol_handle_verify_connect
              (ENetHost *host,ENetEvent *event,ENetPeer *peer,ENetProtocol *command)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_t channelCount;
  enet_uint32 windowSize;
  enet_uint32 mtu;
  ENetProtocol *command_local;
  ENetPeer *peer_local;
  ENetEvent *event_local;
  ENetHost *host_local;
  
  if (peer->state == ENET_PEER_STATE_CONNECTING) {
    uVar2 = ntohl((command->connect).channelCount);
    uVar3 = (ulong)uVar2;
    if ((((uVar3 == 0) || (0xff < uVar3)) ||
        (uVar2 = ntohl((command->connect).packetThrottleInterval),
        uVar2 != peer->packetThrottleInterval)) ||
       (((uVar2 = ntohl((command->connect).packetThrottleAcceleration),
         uVar2 != peer->packetThrottleAcceleration ||
         (uVar2 = ntohl((command->connect).packetThrottleDeceleration),
         uVar2 != peer->packetThrottleDeceleration)) ||
        ((command->connect).connectID != peer->connectID)))) {
      peer->eventData = 0;
      enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
      host_local._4_4_ = -1;
    }
    else {
      enet_protocol_remove_sent_reliable_command(peer,1,0xff);
      if (uVar3 < peer->channelCount) {
        peer->channelCount = uVar3;
      }
      uVar1 = ntohs((command->acknowledge).receivedReliableSequenceNumber);
      peer->outgoingPeerID = uVar1;
      peer->incomingSessionID = (command->connect).incomingSessionID;
      peer->outgoingSessionID = (command->connect).outgoingSessionID;
      channelCount._4_4_ = ntohl((command->connect).mtu);
      if (channelCount._4_4_ < 0x240) {
        channelCount._4_4_ = 0x240;
      }
      else if (0x1000 < channelCount._4_4_) {
        channelCount._4_4_ = 0x1000;
      }
      if (channelCount._4_4_ < peer->mtu) {
        peer->mtu = channelCount._4_4_;
      }
      channelCount._0_4_ = ntohl((command->connect).windowSize);
      if ((uint32_t)channelCount < 0x1000) {
        channelCount._0_4_ = 0x1000;
      }
      if (0x10000 < (uint32_t)channelCount) {
        channelCount._0_4_ = 0x10000;
      }
      if ((uint32_t)channelCount < peer->windowSize) {
        peer->windowSize = (uint32_t)channelCount;
      }
      uVar2 = ntohl((command->connect).incomingBandwidth);
      peer->incomingBandwidth = uVar2;
      uVar2 = ntohl((command->connect).outgoingBandwidth);
      peer->outgoingBandwidth = uVar2;
      enet_protocol_notify_connect(host,peer,event);
      host_local._4_4_ = 0;
    }
  }
  else {
    host_local._4_4_ = 0;
  }
  return host_local._4_4_;
}

Assistant:

static int enet_protocol_handle_verify_connect(ENetHost *host, ENetEvent *event, ENetPeer *peer, const ENetProtocol *command) {
        enet_uint32 mtu, windowSize;
        size_t channelCount;

        if (peer->state != ENET_PEER_STATE_CONNECTING) {
            return 0;
        }

        channelCount = ENET_NET_TO_HOST_32(command->verifyConnect.channelCount);

        if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT || channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT ||
            ENET_NET_TO_HOST_32(command->verifyConnect.packetThrottleInterval) != peer->packetThrottleInterval ||
            ENET_NET_TO_HOST_32(command->verifyConnect.packetThrottleAcceleration) != peer->packetThrottleAcceleration ||
            ENET_NET_TO_HOST_32(command->verifyConnect.packetThrottleDeceleration) != peer->packetThrottleDeceleration ||
            command->verifyConnect.connectID != peer->connectID
        ) {
            peer->eventData = 0;
            enet_protocol_dispatch_state(host, peer, ENET_PEER_STATE_ZOMBIE);
            return -1;
        }

        enet_protocol_remove_sent_reliable_command(peer, 1, 0xFF);

        if (channelCount < peer->channelCount) {
            peer->channelCount = channelCount;
        }

        peer->outgoingPeerID    = ENET_NET_TO_HOST_16(command->verifyConnect.outgoingPeerID);
        peer->incomingSessionID = command->verifyConnect.incomingSessionID;
        peer->outgoingSessionID = command->verifyConnect.outgoingSessionID;

        mtu = ENET_NET_TO_HOST_32(command->verifyConnect.mtu);

        if (mtu < ENET_PROTOCOL_MINIMUM_MTU) {
            mtu = ENET_PROTOCOL_MINIMUM_MTU;
        } else if (mtu > ENET_PROTOCOL_MAXIMUM_MTU) {
            mtu = ENET_PROTOCOL_MAXIMUM_MTU;
        }

        if (mtu < peer->mtu) {
            peer->mtu = mtu;
        }

        windowSize = ENET_NET_TO_HOST_32(command->verifyConnect.windowSize);
        if (windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE) {
            windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        }

        if (windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE) {
            windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        }

        if (windowSize < peer->windowSize) {
            peer->windowSize = windowSize;
        }

        peer->incomingBandwidth = ENET_NET_TO_HOST_32(command->verifyConnect.incomingBandwidth);
        peer->outgoingBandwidth = ENET_NET_TO_HOST_32(command->verifyConnect.outgoingBandwidth);

        enet_protocol_notify_connect(host, peer, event);
        return 0;
    }